

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O3

void __thiscall covenant::CFG::check_well_formed(CFG *this)

{
  long lVar1;
  ostream *poVar2;
  long *plVar3;
  pointer pvVar4;
  pointer __n;
  pointer pPVar5;
  ulong uVar6;
  void *__buf;
  Sym s;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  ostringstream error_msg;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_250;
  ulong local_230;
  CFG local_228;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pvVar4 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __n = (this->prods).
        super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  bVar12 = __n == pvVar4;
  if (bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ERROR: grammar must have at least one production rule.",0x36);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pvVar4 = (this->prods).
             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __n = (this->prods).
          super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (__n == pvVar4) {
    if (bVar12) goto LAB_0012f399;
  }
  else {
    s.x = 1;
    uVar8 = 0;
    uVar6 = 1;
    do {
      if (pvVar4[uVar8].
          super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          pvVar4[uVar8].
          super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ERROR: ",7);
        poVar2 = operator<<((ostream *)local_1a8,s);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2," non-terminal symbol without rule.\n",0x23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Also possible a terminal misinterpreted as nonterminal.\n",
                   0x38);
        pvVar4 = (this->prods).
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __n = (this->prods).
              super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
        bVar12 = true;
      }
      uVar8 = ((long)__n - (long)pvVar4 >> 3) * -0x5555555555555555;
      s.x = s.x + 2;
      bVar11 = uVar6 <= uVar8;
      lVar1 = uVar8 - uVar6;
      uVar8 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar11 && lVar1 != 0);
    if (!(bool)(__n == pvVar4 | bVar12)) {
      uVar8 = 0;
      do {
        pPVar5 = pvVar4[uVar8].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((pvVar4[uVar8].
             super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish != pPVar5) && (!bVar12)) {
          uVar6 = 0;
          local_230 = uVar8;
          do {
            std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                      (&local_250,
                       (this->rules).
                       super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + pPVar5[uVar6].rule);
            if (((long)local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                       _M_impl.super__Vector_impl_data._M_start == 0) || (bVar12)) {
LAB_0012f2fa:
              if (local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0012f2ff;
            }
            else {
              uVar7 = 1;
              uVar10 = 0;
              while( true ) {
                if (((local_250.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar10].x & 1U) == 0) &&
                   ((iVar9 = local_250.
                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar10].x >> 1,
                    iVar9 < this->alphstart || (this->alphsz + this->alphstart <= iVar9)))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ERROR: some terminal symbol is out of range. ",
                             0x2d);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"It must be between ",0x13);
                  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,this->alphstart)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar2," and ",5);
                  plVar3 = (long *)std::ostream::operator<<(poVar2,this->alphsz + this->alphstart);
                  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
                  std::ostream::put((char)plVar3);
                  std::ostream::flush();
                  bVar12 = true;
                  goto LAB_0012f2fa;
                }
                uVar10 = (ulong)uVar7;
                if ((ulong)((long)local_250.
                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_250.
                                  super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar10) break;
                uVar7 = uVar7 + 1;
              }
LAB_0012f2ff:
              operator_delete(local_250.
                              super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar6 = (ulong)((int)uVar6 + 1);
            pvVar4 = (this->prods).
                     super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pPVar5 = pvVar4[uVar8].
                     super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          } while ((uVar6 < (ulong)((long)pvVar4[uVar8].
                                          super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5
                                   >> 2)) && (!bVar12));
          __n = (this->prods).
                super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
          uVar8 = local_230;
        }
        uVar8 = (ulong)((int)uVar8 + 1);
        uVar6 = ((long)__n - (long)pvVar4 >> 3) * -0x5555555555555555;
      } while ((uVar8 <= uVar6 && uVar6 - uVar8 != 0) && (!bVar12));
    }
    if (bVar12) {
LAB_0012f399:
      CFG(&local_228,this);
      write(&local_228,0x1ab2b8,__buf,(size_t)__n);
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::__cxx11::stringbuf::str();
      std::operator<<(poVar2,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      ~CFG(&local_228);
      exit(1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

inline void check_well_formed()
    {
      bool error=false;
      ostringstream error_msg;
      if (prods.size() == 0)
      {
        error=true;
        error_msg << "ERROR: grammar must have at least one production rule." << endl;
      }
      for( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        if (prods[vv].size() == 0){
          error=true;
          error_msg << "ERROR: " 
                    << Sym::mkVar(vv) << " non-terminal symbol without rule.\n"; 
          error_msg << "Also possible a terminal misinterpreted as nonterminal.\n";
        }
      }
      for ( unsigned int vv = 0; (vv < prods.size() && !error); vv++ )
      {
        for ( unsigned int ri = 0; (ri < prods[vv].size() && !error); ri++ )
        {
          const int r = prods[vv][ri].rule;
          vector<Sym> RHS = rules[r];
          if (RHS.size() == 0) continue;
          for (unsigned k=0; ( k < RHS.size() && !error) ;k++)
          {
            if (RHS[k].isTerm () && 
                !(RHS[k].symID () >= alphstart && 
                  RHS[k].symID()  <  alphstart+alphsz)){
              error=true;
              error_msg << "ERROR: some terminal symbol is out of range. ";
              error_msg << "It must be between " << alphstart << " and " << alphstart+alphsz << endl;   
            }
          }
        }
      }
      if (error)
      {
        cout << *this << endl << error_msg.str();
        exit(1);
      }
    }